

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

pool_ptr<soul::AST::Function> __thiscall soul::AST::Block::getParentFunction(Block *this)

{
  bool bVar1;
  Block *in_RSI;
  Block *this_local;
  
  bVar1 = isFunctionMainBlock(in_RSI);
  if (bVar1) {
    (this->super_Statement).super_ASTObject._vptr_ASTObject =
         (_func_int **)(in_RSI->functionForWhichThisIsMain).object;
  }
  else {
    Scope::getParentFunction((Scope *)this);
  }
  return (pool_ptr<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ptr<Function> getParentFunction() const override
        {
            if (isFunctionMainBlock())
                return functionForWhichThisIsMain;

            return Scope::getParentFunction();
        }